

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GetUpdater::GetUpdater(wasm::
(anonymous_namespace)::GlobalRefining&,wasm::Module__
          (void *this,GlobalRefining *parent,Module *wasm)

{
  Module *wasm_local;
  GlobalRefining *parent_local;
  GetUpdater *this_local;
  
  WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)this);
  *(undefined ***)this = &PTR__GetUpdater_0309bb28;
  *(GlobalRefining **)((long)this + 0x130) = parent;
  *(Module **)((long)this + 0x138) = wasm;
  *(undefined1 *)((long)this + 0x140) = 0;
  return;
}

Assistant:

GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}